

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringalgorithms_p.h
# Opt level: O1

QByteArray *
QStringAlgorithms<QByteArray>::simplified_helper(QByteArray *__return_storage_ptr__,QByteArray *str)

{
  undefined1 *size;
  Data *pDVar1;
  char *pcVar2;
  qsizetype qVar3;
  byte *pbVar4;
  QTypedArrayData<char> *__old_val;
  byte bVar5;
  byte *pbVar6;
  longlong __old_val_2;
  byte *pbVar7;
  char *__old_val_1;
  byte *pbVar8;
  long in_FS_OFFSET;
  bool bVar9;
  QByteArray local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  size = (undefined1 *)(str->d).size;
  if (size == (undefined1 *)0x0) {
    pDVar1 = (str->d).d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (str->d).ptr;
    (__return_storage_ptr__->d).size = 0;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    pbVar8 = (byte *)(str->d).ptr;
    local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    pDVar1 = (str->d).d;
    if ((pDVar1 == (Data *)0x0) ||
       ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 1)) {
      QByteArray::QByteArray(&local_38,(qsizetype)size,Uninitialized);
    }
    else {
      (str->d).d = (Data *)0x0;
      (str->d).ptr = (char *)0x0;
      (str->d).size = 0;
      local_38.d.d = pDVar1;
      local_38.d.ptr = (char *)pbVar8;
      local_38.d.size = (qsizetype)size;
    }
    pbVar7 = pbVar8 + (long)size;
    pbVar6 = (byte *)local_38.d.ptr;
    while( true ) {
      while (((pbVar8 != pbVar7 && (*pbVar8 < 0x40)) &&
             ((1L << (*pbVar8 & 0x3f) & 0x100003e00U) != 0))) {
        pbVar8 = pbVar8 + 1;
      }
      bVar9 = pbVar8 == pbVar7;
      if (bVar9) break;
      bVar5 = *pbVar8;
      if ((0x3f < bVar5) || ((1L << (bVar5 & 0x3f) & 0x100003e00U) == 0)) {
        pbVar4 = pbVar8 + 1;
        do {
          pbVar8 = pbVar4;
          *pbVar6 = bVar5;
          bVar9 = pbVar8 == pbVar7;
          if (bVar9) {
            pbVar6 = pbVar6 + 1;
            goto LAB_0030b4ac;
          }
          bVar5 = *pbVar8;
          pbVar6 = pbVar6 + 1;
          pbVar4 = pbVar8 + 1;
        } while ((0x3f < bVar5) || ((1L << (bVar5 & 0x3f) & 0x100003e00U) == 0));
      }
      if (bVar9) break;
      *pbVar6 = 0x20;
      pbVar6 = pbVar6 + 1;
    }
LAB_0030b4ac:
    if ((pbVar6 != (byte *)local_38.d.ptr) && (pbVar6[-1] == 0x20)) {
      pbVar6 = pbVar6 + -1;
    }
    QByteArray::resize(&local_38,(long)pbVar6 - (long)local_38.d.ptr);
    qVar3 = local_38.d.size;
    pcVar2 = local_38.d.ptr;
    pDVar1 = local_38.d.d;
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = (char *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = pcVar2;
    local_38.d.size = 0;
    (__return_storage_ptr__->d).size = qVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

static inline StringType simplified_helper(StringType &str)
    {
        if (str.isEmpty())
            return str;
        const Char *src = str.cbegin();
        const Char *end = str.cend();
        NakedStringType result = isConst || !str.isDetached() ?
                                     StringType(str.size(), Qt::Uninitialized) :
                                     std::move(str);

        Char *dst = const_cast<Char *>(result.cbegin());
        Char *ptr = dst;
        bool unmodified = true;
        while (true) {
            while (src != end && isSpace(*src))
                ++src;
            while (src != end && !isSpace(*src))
                *ptr++ = *src++;
            if (src == end)
                break;
            if (*src != QChar::Space)
                unmodified = false;
            *ptr++ = QChar::Space;
        }
        if (ptr != dst && ptr[-1] == QChar::Space)
            --ptr;

        qsizetype newlen = ptr - dst;
        if (isConst && newlen == str.size() && unmodified) {
            // nothing happened, return the original
            return str;
        }
        result.resize(newlen);
        return result;
    }